

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

double SoapySDRDevice_getGain(SoapySDRDevice *device,int direction,size_t channel)

{
  undefined1 *puVar1;
  double dVar2;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  dVar2 = (double)(**(code **)(*(long *)device + 0x198))(device,direction,channel);
  return dVar2;
}

Assistant:

double SoapySDRDevice_getGain(const SoapySDRDevice *device, const int direction, const size_t channel)
{
    __SOAPY_SDR_C_TRY
    return device->getGain(direction, channel);
    __SOAPY_SDR_C_CATCH_RET(NAN);
}